

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O2

void history_lose_artifact(player *p,artifact *artifact)

{
  byte bVar1;
  size_t sVar2;
  history_info *phVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  artifact *in_RDX;
  bitflag flags [2];
  char text [80];
  char o_name [80];
  
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-history.c"
                  ,0xf8,"void history_lose_artifact(struct player *, const struct artifact *)");
  }
  sVar2 = (p->hist).next;
  lVar6 = sVar2 + 1;
  lVar4 = sVar2 * 0x5c;
  do {
    lVar5 = lVar4;
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) {
      get_artifact_name(o_name,(size_t)artifact,in_RDX);
      strnfmt(text,0x50,"Missed %s",o_name);
      flag_wipe(flags,2);
      flag_on_dbg(flags,2,2,"flags","HIST_ARTIFACT_UNKNOWN");
      flag_on_dbg(flags,2,4,"flags","HIST_ARTIFACT_LOST");
      history_add_with_flags(p,text,flags,artifact);
      return;
    }
    phVar3 = (p->hist).entries;
    bVar1 = phVar3->type[lVar5 + -0x56];
    in_RDX = (artifact *)(ulong)bVar1;
    lVar4 = lVar5 + -0x5c;
  } while (artifact->aidx != (uint)bVar1);
  flag_on_dbg(phVar3[-1].type + lVar5,2,4,"h->entries[i].type","HIST_ARTIFACT_LOST");
  return;
}

Assistant:

void history_lose_artifact(struct player *p, const struct artifact *artifact)
{
	assert(artifact != NULL);

	/* Try to mark it as lost if it's already in history */
	if (!history_mark_artifact_lost(&p->hist, artifact)) {
		/* Otherwise add a new entry */
		char o_name[80];
		char text[80];

		get_artifact_name(o_name, sizeof(o_name), artifact);
		strnfmt(text, sizeof(text), "Missed %s", o_name);

		bitflag flags[HIST_SIZE];
		hist_wipe(flags);
		hist_on(flags, HIST_ARTIFACT_UNKNOWN);
		hist_on(flags, HIST_ARTIFACT_LOST);

		history_add_with_flags(p, text, flags, artifact);
	}
}